

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O0

void __thiscall XMLElement::XMLElement(XMLElement *this,XMLElement *old)

{
  XMLElement *old_local;
  XMLElement *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)old);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_attributes,&old->m_attributes);
  XMLElementBody::XMLElementBody(&this->m_body,&old->m_body);
  return;
}

Assistant:

XMLElement(const XMLElement& old)
        : m_name(old.m_name), m_attributes(old.m_attributes), m_body(old.m_body)
    {
    }